

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

int slow_bitmap_full(unsigned_long *bitmap,long bits)

{
  long lim;
  long k;
  long bits_local;
  unsigned_long *bitmap_local;
  
  lim = 0;
  while( true ) {
    if ((long)((ulong)bits >> 6) <= lim) {
      if (((bits & 0x3fU) == 0) ||
         (((bitmap[lim] ^ 0xffffffffffffffff) & 0xffffffffffffffffU >> (-(char)bits & 0x3fU)) == 0))
      {
        bitmap_local._4_4_ = 1;
      }
      else {
        bitmap_local._4_4_ = 0;
      }
      return bitmap_local._4_4_;
    }
    if (bitmap[lim] != 0xffffffffffffffff) break;
    lim = lim + 1;
  }
  return 0;
}

Assistant:

int slow_bitmap_full(const unsigned long *bitmap, long bits)
{
    long k, lim = bits/BITS_PER_LONG;

    for (k = 0; k < lim; ++k) {
        if (~bitmap[k]) {
            return 0;
        }
    }

    if (bits % BITS_PER_LONG) {
        if (~bitmap[k] & BITMAP_LAST_WORD_MASK(bits)) {
            return 0;
        }
    }

    return 1;
}